

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Sequence::Get_y_dxdx(ChFunction_Sequence *this,double x)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  p_Var1 = (this->functions).
           super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>._M_impl._M_node
           .super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)&this->functions) {
    dVar2 = 0.0;
  }
  else {
    dVar2 = 0.0;
    do {
      if (((double)p_Var1[3]._M_next <= x) && (x < (double)p_Var1[3]._M_prev)) {
        dVar2 = (double)(**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x30))
                                  (x - (double)p_Var1[3]._M_next);
        dVar2 = dVar2 + (double)p_Var1[5]._M_next;
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->functions);
  }
  return dVar2;
}

Assistant:

double ChFunction_Sequence::Get_y_dxdx(double x) const {
    double res = 0;
    double localtime;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            localtime = x - iter->t_start;
            res = iter->fx->Get_y_dxdx(localtime) + iter->Iydtdt;
        }
    }
    return res;
}